

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

string * getHomePath_abi_cxx11_(void)

{
  char *pcVar1;
  char *pcVar2;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = getenv("QGREP_HOME");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("HOME");
  }
  pcVar2 = getenv("HOMEDRIVE");
  __rhs = getenv("HOMEPATH");
  if (((pcVar1 == (char *)0x0) && (pcVar2 == (char *)0x0)) && (__rhs == (char *)0x0)) {
    std::__cxx11::string::string((string *)in_RDI,"",(allocator *)&local_68);
  }
  else {
    if (pcVar1 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_48,pcVar2,&local_69);
      std::operator+(&local_68,&local_48,__rhs);
    }
    else {
      std::__cxx11::string::string((string *)&local_68,pcVar1,(allocator *)&local_48);
    }
    std::operator+(in_RDI,&local_68,"/.qgrep");
    std::__cxx11::string::~string((string *)&local_68);
    if (pcVar1 == (char *)0x0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  return in_RDI;
}

Assistant:

static std::string getHomePath()
{
    char* qghome = getenv("QGREP_HOME");
    char* home = qghome ? qghome : getenv("HOME");
	const char* drive = getenv("HOMEDRIVE");
	const char* path = getenv("HOMEPATH");

    if (!home && !drive && !path) return "";

	return (home ? std::string(home) : std::string(drive) + path) + "/.qgrep";
}